

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

_Bool tlb_force_broadcast(CPUARMState_conflict *env)

{
  int iVar1;
  _Bool local_11;
  CPUARMState_conflict *env_local;
  
  local_11 = false;
  if (((env->cp15).hcr_el2 & 0x200) != 0) {
    iVar1 = arm_current_el(env);
    local_11 = false;
    if (iVar1 == 1) {
      local_11 = arm_is_secure_below_el3(env);
    }
  }
  return local_11;
}

Assistant:

static bool tlb_force_broadcast(CPUARMState *env)
{
    return (env->cp15.hcr_el2 & HCR_FB) &&
        arm_current_el(env) == 1 && arm_is_secure_below_el3(env);
}